

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O1

void skiwi::compile_vector(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab_00;
  uint64_t lab_01;
  string lab;
  string done;
  string done2;
  operand local_8c [3];
  string local_80;
  int local_5c;
  string local_58;
  string local_38;
  
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_58,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_38,psVar1,lab_00);
  if (ops->safe_primitives == true) {
    local_80._M_dataplus._M_p._0_4_ = 0x40;
    local_8c[0] = RAX;
    local_8c[1] = 0x14;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,(operation *)&local_80,local_8c,local_8c + 1);
    local_80._M_dataplus._M_p._0_4_ = 0x2b;
    local_8c[0] = RAX;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_80,local_8c);
    check_heap(code,re_vector_heap_overflow);
  }
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = RAX;
  local_8c[1] = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,local_8c + 1);
  local_8c[0] = ST6;
  local_8c[1] = 0x18;
  local_8c[2] = 0x39;
  local_80._M_dataplus._M_p = (pointer)0x600000000000000;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_8c,local_8c + 1,local_8c + 2,(unsigned_long *)&local_80);
  local_80._M_dataplus._M_p._0_4_ = 0x49;
  local_8c[0] = RAX;
  local_8c[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,local_8c + 1);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = R15;
  local_8c[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,local_8c + 1);
  local_80._M_dataplus._M_p._0_4_ = 0x49;
  local_8c[0] = R15;
  local_8c[1] = 0x39;
  local_8c[2] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = MEM_RBP;
  local_8c[1] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,local_8c + 1);
  local_80._M_dataplus._M_p._0_4_ = 5;
  local_8c[0] = R11;
  local_8c[1] = 0x39;
  local_8c[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_80,&local_58);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = MEM_RBP;
  local_8c[1] = 8;
  local_8c[2] = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,(int *)(local_8c + 1),local_8c + 2);
  local_80._M_dataplus._M_p._0_4_ = 5;
  local_8c[0] = R11;
  local_8c[1] = 0x39;
  local_8c[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_80,&local_58);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = MEM_RBP;
  local_8c[1] = 0x10;
  local_8c[2] = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,(int *)(local_8c + 1),local_8c + 2);
  local_80._M_dataplus._M_p._0_4_ = 5;
  local_8c[0] = R11;
  local_8c[1] = 0x39;
  local_8c[2] = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_80,&local_58);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = MEM_RBP;
  local_8c[1] = 0x18;
  local_8c[2] = 0xd;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,(int *)(local_8c + 1),local_8c + 2);
  local_80._M_dataplus._M_p._0_4_ = 5;
  local_8c[0] = R11;
  local_8c[1] = 0x39;
  local_8c[2] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_80,&local_58);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = MEM_RBP;
  local_8c[1] = 0x20;
  local_8c[2] = 0xe;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,(int *)(local_8c + 1),local_8c + 2);
  local_80._M_dataplus._M_p._0_4_ = 5;
  local_8c[0] = R11;
  local_8c[1] = 0x39;
  local_8c[2] = 4;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_80,&local_58);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = MEM_RBP;
  local_8c[1] = 0x28;
  local_8c[2] = 0x11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,(int *)(local_8c + 1),local_8c + 2);
  local_80._M_dataplus._M_p._0_4_ = 5;
  local_8c[0] = R11;
  local_8c[1] = 0x39;
  local_8c[2] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_80,&local_58);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = MEM_RBP;
  local_8c[1] = 0x30;
  local_8c[2] = 0x12;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,(int *)(local_8c + 1),local_8c + 2);
  local_80._M_dataplus._M_p._0_4_ = 5;
  local_8c[0] = R11;
  local_8c[1] = 0x39;
  local_8c[2] = 6;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_80,&local_58);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = MEM_RBP;
  local_8c[1] = 0x38;
  local_8c[2] = 0x15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,(int *)(local_8c + 1),local_8c + 2);
  local_80._M_dataplus._M_p._0_4_ = 5;
  local_8c[0] = R11;
  local_8c[1] = 0x39;
  local_8c[2] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_80,&local_58);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = MEM_RBP;
  local_8c[1] = 0x40;
  local_8c[2] = 0x17;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_80,local_8c,(int *)(local_8c + 1),local_8c + 2);
  local_80._M_dataplus._M_p._0_4_ = 5;
  local_8c[0] = R11;
  local_8c[1] = 0x39;
  local_8c[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_80,&local_58);
  local_80._M_dataplus._M_p._0_4_ = 0x58;
  local_8c[0] = R11;
  local_8c[1] = 0x39;
  local_8c[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0;
  local_8c[0] = RBP;
  local_8c[1] = 0x39;
  local_8c[2] = 0x48;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_8c[0] = RDX;
  local_8c[1] = 0x23;
  local_8c[2] = 0x88;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,local_8c,local_8c + 1,(int *)(local_8c + 2));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_80,psVar1,lab_01);
  local_8c[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_8c,&local_80);
  local_8c[0] = ST6;
  local_8c[1] = 0xb;
  local_8c[2] = 0x1c;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_8c,local_8c + 1,local_8c + 2);
  local_8c[0] = ST6;
  local_8c[1] = 0x20;
  local_8c[2] = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_8c,local_8c + 1,local_8c + 2);
  local_8c[0] = EMPTY;
  local_8c[1] = 0x10;
  local_8c[2] = 0x39;
  local_5c = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_8c,local_8c + 1,local_8c + 2,&local_5c);
  local_8c[0] = EMPTY;
  local_8c[1] = 0xc;
  local_8c[2] = 0x39;
  local_5c = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_8c,local_8c + 1,local_8c + 2,&local_5c);
  local_8c[0] = RSI;
  local_8c[1] = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_8c,local_8c + 1);
  local_8c[0] = BYTE_MEM_RSP;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_8c,&local_38);
  local_8c[0] = BYTE_MEM_R12;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_8c,&local_80);
  local_8c[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_8c,&local_58);
  local_8c[0] = BYTE_MEM_RCX;
  local_8c[1] = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_8c,local_8c + 1);
  local_8c[0] = XMM13|CL;
  local_8c[1] = 0x14;
  local_8c[2] = 0x39;
  local_5c = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_8c,local_8c + 1,local_8c + 2,&local_5c);
  local_8c[0] = EMPTY;
  local_8c[1] = 0x10;
  local_8c[2] = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_8c,local_8c + 1,local_8c + 2);
  local_8c[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_8c,&local_38);
  local_8c[0] = ST6;
  local_8c[1] = 9;
  local_8c[2] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_8c,local_8c + 1,local_8c + 2);
  local_8c[0] = BYTE_MEM_RDX;
  local_8c[1] = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_8c,local_8c + 1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void compile_vector(asmcode& code, const compiler_options& ops)
  {
  auto done = label_to_string(label++);
  auto done2 = label_to_string(label++);
  if (ops.safe_primitives)
    {
    code.add(asmcode::MOV, asmcode::RAX, asmcode::R11);
    code.add(asmcode::INC, asmcode::RAX);
    check_heap(code, re_vector_heap_overflow);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R11);
  code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, (uint64_t)vector_tag << (uint64_t)block_shift);
  code.add(asmcode::OR, asmcode::RAX, asmcode::R15);
  code.add(asmcode::MOV, asmcode::R15, ALLOC);
  code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JE, done); // assembly can jump short, but vm cannot
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::RCX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(2), asmcode::RDX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(3), asmcode::RSI);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(4), asmcode::RDI);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 4);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(5), asmcode::R8);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 5);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(6), asmcode::R9);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 6);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(7), asmcode::R12);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 7);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(8), asmcode::R14);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 8);
  code.add(asmcode::JES, done);

  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 8);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(9));
  code.add(asmcode::MOV, asmcode::RDX, LOCAL);

  auto lab = label_to_string(label++);
  code.add(asmcode::LABEL, lab);

  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RDX);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RCX);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::ADD, asmcode::RDX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::JE, done2);
  code.add(asmcode::JMPS, lab);

  code.add(asmcode::LABEL, done);
  code.add(asmcode::INC, asmcode::R11);
  code.add(asmcode::SHL, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::ADD, ALLOC, asmcode::R11);
  code.add(asmcode::LABEL, done2);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R15);
  code.add(asmcode::JMP, CONTINUE);
  }